

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
* __thiscall
google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::
TryEmplaceInternal<char_const(&)[2]>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
           *__return_storage_ptr__,Map<std::__cxx11::string,std::__cxx11::string> *this,
          char (*k) [2])

{
  Arena *arena;
  BaseIt it;
  BaseIt it_00;
  Node *__s;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ptr;
  NodeAndBucket NVar2;
  bool local_111;
  NodeBase *local_110;
  Map<std::__cxx11::string,std::__cxx11::string> *local_108;
  map_index_t local_100;
  undefined4 uStack_fc;
  iterator local_f8;
  NodeBase *local_e0;
  Node *node;
  bool local_c1;
  NodeBase *local_c0;
  Map<std::__cxx11::string,std::__cxx11::string> *local_b8;
  map_index_t local_b0;
  undefined4 uStack_ac;
  iterator local_a8;
  map_index_t local_8c;
  undefined1 auStack_88 [4];
  map_index_t b;
  NodeBase *local_78;
  NodeAndBucket p;
  char (*k_local) [2];
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  NodeBase *local_20;
  Node *node_1;
  Map<std::__cxx11::string,std::__cxx11::string> *local_10;
  
  p._8_8_ = k;
  _auStack_88 = internal::
                TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::ToView<char[2]>(k);
  NVar2 = internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::FindHelper((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,_auStack_88);
  local_c0 = NVar2.node;
  local_b0 = NVar2.bucket;
  local_8c = local_b0;
  local_78 = local_c0;
  p.node._0_4_ = local_b0;
  if (local_c0 == (NodeBase *)0x0) {
    bVar1 = internal::
            KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,(ulong)(*(int *)this + 1));
    if (bVar1) {
      _node = internal::
              TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::ToView<char[2]>((char (*) [2])p._8_8_);
      local_8c = internal::
                 KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::BucketNumber((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this,_node);
    }
    node_1 = (Node *)p._8_8_;
    local_10 = this;
    local_20 = internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x48);
    bVar1 = internal::InitializeMapKey<std::__cxx11::string,char_const(&)[2]>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_20 + 1),(char (*) [2])node_1,*(Arena **)(this + 0x18));
    __s = node_1;
    if (!bVar1) {
      ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_20 + 1);
      arena = *(Arena **)(this + 0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(char *)__s,&local_41);
      Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string>(ptr,arena,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    Arena::CreateInArenaStorage<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_20 + 5),
               *(Arena **)(this + 0x18));
    local_e0 = local_20;
    internal::
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,local_8c,(KeyNode *)local_20);
    *(int *)this = *(int *)this + 1;
    local_110 = local_e0;
    local_100 = local_8c;
    it_00._20_4_ = uStack_fc;
    it_00.bucket_index_ = local_8c;
    it_00.m_ = (UntypedMapBase *)this;
    it_00.node_ = local_e0;
    local_108 = this;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::iterator::iterator(&local_f8,it_00);
    local_111 = true;
    std::make_pair<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::iterator,bool>
              (__return_storage_ptr__,&local_f8,&local_111);
  }
  else {
    it._20_4_ = uStack_ac;
    it.bucket_index_ = local_b0;
    it.m_ = (UntypedMapBase *)this;
    it.node_ = local_c0;
    local_b8 = this;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::iterator::iterator(&local_a8,it);
    local_c1 = false;
    std::make_pair<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::iterator,bool>
              (__return_storage_ptr__,&local_a8,&local_c1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }